

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O2

void loghex(uchar *buffer,ssize_t len)

{
  long lVar1;
  long lVar2;
  char *buffer_00;
  char data [1200];
  char acStack_4e8 [1208];
  
  buffer_00 = acStack_4e8;
  lVar1 = 0;
  for (lVar2 = 0; (lVar1 < len && (-1 < (int)(lVar2 + 0x4b0U))); lVar2 = lVar2 + -2) {
    curl_msnprintf(buffer_00,lVar2 + 0x4b0U & 0xffffffff,"%02x",(ulong)buffer[lVar1]);
    buffer_00 = buffer_00 + 2;
    lVar1 = lVar1 + 1;
  }
  if (lVar2 != 0) {
    logmsg("\'%s\'",acStack_4e8);
  }
  return;
}

Assistant:

static void loghex(unsigned char *buffer, ssize_t len)
{
  char data[1200];
  ssize_t i;
  unsigned char *ptr = buffer;
  char *optr = data;
  ssize_t width = 0;
  int left = sizeof(data);

  for(i = 0; i<len && (left >= 0); i++) {
    msnprintf(optr, left, "%02x", ptr[i]);
    width += 2;
    optr += 2;
    left -= 2;
  }
  if(width)
    logmsg("'%s'", data);
}